

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O3

bool __thiscall brynet::net::DataSocket::onEnterEventLoop(DataSocket *this,PTR *eventLoop)

{
  ENTER_CALLBACK *pEVar1;
  int iVar2;
  EventLoop *this_00;
  _Manager_type p_Var3;
  TcpSocket *pTVar4;
  bool bVar5;
  sock sVar6;
  THREAD_ID_TYPE *pTVar7;
  DataSocket *local_20;
  
  iVar2 = ((eventLoop->super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->mSelfThreadID;
  pTVar7 = CurrentThread::tid();
  if (iVar2 != *pTVar7) {
    __assert_fail("eventLoop->isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                  ,0x48,"bool brynet::net::DataSocket::onEnterEventLoop(const EventLoop::PTR &)");
  }
  iVar2 = ((eventLoop->super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->mSelfThreadID;
  pTVar7 = CurrentThread::tid();
  if (iVar2 == *pTVar7) {
    if ((this->mEventLoop).super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      __assert_fail("mEventLoop == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                    ,0x4d,"bool brynet::net::DataSocket::onEnterEventLoop(const EventLoop::PTR &)");
    }
    (this->mEventLoop).super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (eventLoop->super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(eventLoop->super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    sVar6 = TcpSocket::getFD((this->mSocket)._M_t.
                             super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                             .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    bVar5 = base::SocketNonblock(sVar6);
    if (bVar5) {
      this_00 = (this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar6 = TcpSocket::getFD((this->mSocket)._M_t.
                               super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                               .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl)
      ;
      bVar5 = EventLoop::linkChannel(this_00,sVar6,&this->super_Channel);
      if (bVar5) {
        if ((this->mEnterCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
          return true;
        }
        pEVar1 = &this->mEnterCallback;
        local_20 = this;
        (*(this->mEnterCallback)._M_invoker)((_Any_data *)pEVar1,&local_20);
        p_Var3 = (this->mEnterCallback).super__Function_base._M_manager;
        if (p_Var3 == (_Manager_type)0x0) {
          return true;
        }
        (*p_Var3)((_Any_data *)pEVar1,(_Any_data *)pEVar1,__destroy_functor);
        (this->mEnterCallback).super__Function_base._M_manager = (_Manager_type)0x0;
        (this->mEnterCallback)._M_invoker = (_Invoker_type)0x0;
        return true;
      }
    }
    pTVar4 = (this->mSocket)._M_t.
             super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
             .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
    if (pTVar4 != (TcpSocket *)0x0) {
      this->mCanWrite = false;
      (this->mSocket)._M_t.
      super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
      super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
      super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
      (*pTVar4->_vptr_TcpSocket[1])();
    }
  }
  return false;
}

Assistant:

bool DataSocket::onEnterEventLoop(const EventLoop::PTR& eventLoop)
{
    assert(eventLoop->isInLoopThread());
    if (!eventLoop->isInLoopThread())
    {
        return false;
    }
    assert(mEventLoop == nullptr);
    if (mEventLoop != nullptr)
    {
        return false;
    }

    mEventLoop = eventLoop;

    if (!brynet::net::base::SocketNonblock(mSocket->getFD()))
    {
        closeSocket();
        return false;
    }
    if (!mEventLoop->linkChannel(mSocket->getFD(), this))
    {
        closeSocket();
        return false;
    }

#ifdef USE_OPENSSL
    if (mSSL != nullptr)
    {
        processSSLHandshake();
        return true;
    }
#endif

    if (!checkRead())
    {
        closeSocket();
        return false;
    }

    if (mEnterCallback != nullptr)
    {
        mEnterCallback(this);
        mEnterCallback = nullptr;
    }

    return true;
}